

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

void DumpPtr(textwriter *Text,tchar_t *Name,node *Node,dataid Id,tchar_t *Value,size_t ValueLen)

{
  undefined4 local_40;
  undefined4 local_3c;
  wchar_t i;
  fourcc_t ClassId;
  size_t ValueLen_local;
  tchar_t *Value_local;
  dataid Id_local;
  node *Node_local;
  tchar_t *Name_local;
  textwriter *Text_local;
  
  _i = ValueLen;
  ValueLen_local = (size_t)Value;
  Value_local = (tchar_t *)Id;
  Id_local = (dataid)Node;
  Node_local = (node *)Name;
  Name_local = (tchar_t *)Text;
  TextAttrib(Text,Name,&Id_local,0xf);
  if (Id_local != 0) {
    if (Id_local == 0) {
      __assert_fail("(const void*)(Node)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x12d,
                    "void DumpPtr(textwriter *, const tchar_t *, node *, dataid, tchar_t *, size_t)"
                   );
    }
    local_3c = *(undefined4 *)(*(long *)(Id_local + 8) + 8);
    tcscpy_s((tchar_t *)ValueLen_local,_i,(tchar_t *)Node_local);
    tcscat_s((tchar_t *)ValueLen_local,_i,"_Class");
    TextAttrib((textwriter *)Name_local,(tchar_t *)ValueLen_local,&local_3c,8);
  }
  if (Value_local != (tchar_t *)0x0) {
    local_40 = SUB84(Value_local,0);
    tcscpy_s((tchar_t *)ValueLen_local,_i,(tchar_t *)Node_local);
    tcscat_s((tchar_t *)ValueLen_local,_i,"_Id");
    TextAttrib((textwriter *)Name_local,(tchar_t *)ValueLen_local,&local_40,2);
  }
  return;
}

Assistant:

static NOINLINE void DumpPtr(textwriter* Text, const tchar_t* Name, node* Node, dataid Id, tchar_t* Value, size_t ValueLen)
{
    TextAttrib(Text,Name,&Node,TYPE_PTR);

    if (Node)
    {
        fourcc_t ClassId = Node_ClassId(Node);
        tcscpy_s(Value,ValueLen,Name);
        tcscat_s(Value,ValueLen,T("_Class"));
        TextAttrib(Text,Value,&ClassId,TYPE_FOURCC);
    }

    if (Id)
    {
        int i = (int)Id;
        tcscpy_s(Value,ValueLen,Name);
        tcscat_s(Value,ValueLen,T("_Id"));
        TextAttrib(Text,Value,&i,TYPE_INT);
    }
}